

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureDivision.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
          (StructureDivision *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it)

{
  bool bVar1;
  int local_24;
  int local_20;
  int local_1c;
  
  bVar1 = isHead(this);
  if (bVar1) {
    local_1c = (this->tail).fields._M_elems[0];
    local_20 = (this->tail).fields._M_elems[1];
    local_24 = (this->tail).fields._M_elems[2];
    tools::disco::
    Record<njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::
    write<std::back_insert_iterator<std::__cxx11::string>,double,double,long,long,long,long,int,int,int>
              (it,&(this->base).fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Head_base<0UL,_double,_false>._M_head_impl,
               &(this->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Head_base<1UL,_double,_false>._M_head_impl,
               &(this->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl,
               &(this->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                _M_head_impl,
               (long *)((long)&(this->base).fields.
                               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                               super__Tuple_impl<2UL,_long,_long,_long,_long>.
                               super__Tuple_impl<3UL,_long,_long,_long>.
                               super__Tuple_impl<4UL,_long,_long> + 8),(long *)this,&local_1c,
               &local_20,&local_24);
  }
  else {
    local_1c = (this->tail).fields._M_elems[0];
    local_20 = (this->tail).fields._M_elems[1];
    local_24 = (this->tail).fields._M_elems[2];
    tools::disco::
    Record<njoy::tools::disco::Integer<70u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              (it,&local_1c,&local_20,&local_24);
  }
  return;
}

Assistant:

void print( OutputIterator& it ) const {

      using namespace njoy::tools;
      if ( this->isHead() ) {

        using Format = disco::Record< disco::ENDF, disco::ENDF,
                                      disco::Integer< 11 >, disco::Integer< 11 >,
                                      disco::Integer< 11 >, disco::Integer< 11 >,
                                      disco::Integer< 4 >, disco::Integer< 2>,
                                      disco::Integer< 3 >,
                                      disco::Column<5> >;
        Format::write( it, std::get< 0 >( this->base.fields ),
                           std::get< 1 >( this->base.fields ),
                           std::get< 2 >( this->base.fields ),
                           std::get< 3 >( this->base.fields ),
                           std::get< 4 >( this->base.fields ),
                           std::get< 5 >( this->base.fields ),
                           this->tail.MAT(), this->tail.MF(), this->tail.MT() );
      }
      else {

        using Format = disco::Record< disco::Integer< 70 >,
                                      disco::Integer< 2 >,
                                      disco::Integer< 3 >,
                                      disco::Column<5> >;
        Format::write( it, this->tail.MAT(), this->tail.MF(), this->tail.MT() );
      }
    }